

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O3

int __thiscall
packed_gamma_file3<unsigned_int,_6UL>::close(packed_gamma_file3<unsigned_int,_6UL> *this,int __fd)

{
  pointer puVar1;
  iterator __position;
  bool bVar2;
  undefined8 uVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ushort uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  uint local_c;
  
  puVar1 = (this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  if (uVar8 % 6 != 0) {
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15[8] = 0x40;
    auVar15._0_8_ = 0x4040404040404040;
    auVar15[9] = 0x40;
    auVar15[10] = 0x40;
    auVar15[0xb] = 0x40;
    auVar15[0xc] = 0x40;
    auVar15[0xd] = 0x40;
    auVar15[0xe] = 0x40;
    auVar15[0xf] = 0x40;
    lVar9 = uVar8 - uVar8 % 6;
    uVar10 = lVar9 + 1U;
    if (lVar9 + 1U < uVar8) {
      uVar10 = uVar8;
    }
    uVar8 = 0;
    auVar20 = vpbroadcastq_avx512f();
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar23 = auVar21;
      auVar21 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar21,auVar18);
      auVar21 = vporq_avx512f(auVar21,auVar19);
      uVar3 = vpcmpuq_avx512f(auVar21,auVar20,2);
      bVar5 = (byte)uVar3;
      uVar3 = vpcmpuq_avx512f(auVar22,auVar20,2);
      bVar6 = (byte)uVar3;
      uVar11 = CONCAT11(bVar6,bVar5);
      auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar1 + lVar9 + uVar8));
      auVar16._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar21._4_4_;
      auVar16._0_4_ = (uint)(bVar5 & 1) * auVar21._0_4_;
      auVar16._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar21._8_4_;
      auVar16._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar21._12_4_;
      auVar16._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar21._16_4_;
      auVar16._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar21._20_4_;
      auVar16._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar21._24_4_;
      auVar16._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar21._28_4_;
      auVar22._32_4_ = (uint)(bVar6 & 1) * auVar21._32_4_;
      auVar22._0_32_ = auVar16;
      auVar22._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar21._36_4_;
      auVar22._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar21._40_4_;
      auVar22._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar21._44_4_;
      auVar22._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar21._48_4_;
      auVar22._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar21._52_4_;
      auVar22._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar21._56_4_;
      auVar22._60_4_ = (uint)(bVar6 >> 7) * auVar21._60_4_;
      uVar8 = uVar8 + 0x10;
      auVar17 = vextracti64x4_avx512f(auVar22,1);
      auVar21 = vpmovzxdq_avx512f(auVar16);
      uVar4 = vptestnmd_avx512f(auVar22,auVar22);
      auVar22 = vpmovzxdq_avx512f(auVar17);
      auVar21 = vplzcntq_avx512cd(auVar21);
      auVar22 = vplzcntq_avx512cd(auVar22);
      auVar12 = vpmovqb_avx512f(auVar21);
      auVar13 = vpmovqb_avx512f(auVar22);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar13._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = auVar12._0_8_;
      auVar12 = vpunpcklqdq_avx(auVar13,auVar24);
      auVar12 = vpsubb_avx(auVar15,auVar12);
      auVar13 = vpbroadcastb_avx512vl(ZEXT116(1));
      bVar2 = (bool)((byte)uVar4 & 1);
      auVar14[0] = bVar2 * auVar13[0] | !bVar2 * auVar12[0];
      bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar14[1] = bVar2 * auVar13[1] | !bVar2 * auVar12[1];
      bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar14[2] = bVar2 * auVar13[2] | !bVar2 * auVar12[2];
      bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar14[3] = bVar2 * auVar13[3] | !bVar2 * auVar12[3];
      bVar2 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar14[4] = bVar2 * auVar13[4] | !bVar2 * auVar12[4];
      bVar2 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar14[5] = bVar2 * auVar13[5] | !bVar2 * auVar12[5];
      bVar2 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar14[6] = bVar2 * auVar13[6] | !bVar2 * auVar12[6];
      bVar2 = (bool)((byte)(uVar4 >> 7) & 1);
      auVar14[7] = bVar2 * auVar13[7] | !bVar2 * auVar12[7];
      bVar2 = (bool)((byte)(uVar4 >> 8) & 1);
      auVar14[8] = bVar2 * auVar13[8] | !bVar2 * auVar12[8];
      bVar2 = (bool)((byte)(uVar4 >> 9) & 1);
      auVar14[9] = bVar2 * auVar13[9] | !bVar2 * auVar12[9];
      bVar2 = (bool)((byte)(uVar4 >> 10) & 1);
      auVar14[10] = bVar2 * auVar13[10] | !bVar2 * auVar12[10];
      bVar2 = (bool)((byte)(uVar4 >> 0xb) & 1);
      auVar14[0xb] = bVar2 * auVar13[0xb] | !bVar2 * auVar12[0xb];
      bVar2 = (bool)((byte)(uVar4 >> 0xc) & 1);
      auVar14[0xc] = bVar2 * auVar13[0xc] | !bVar2 * auVar12[0xc];
      bVar2 = (bool)((byte)(uVar4 >> 0xd) & 1);
      auVar14[0xd] = bVar2 * auVar13[0xd] | !bVar2 * auVar12[0xd];
      bVar2 = (bool)((byte)(uVar4 >> 0xe) & 1);
      auVar14[0xe] = bVar2 * auVar13[0xe] | !bVar2 * auVar12[0xe];
      bVar2 = SUB81(uVar4 >> 0xf,0);
      auVar14[0xf] = bVar2 * auVar13[0xf] | !bVar2 * auVar12[0xf];
      auVar12 = vpmaxub_avx(auVar23._0_16_,auVar14);
      auVar21 = ZEXT1664(auVar12);
    } while (((uVar10 - lVar9) + 0xf & 0xfffffffffffffff0) != uVar8);
    auVar15 = vmovdqu8_avx512vl(auVar12);
    auVar12[0] = (bVar5 & 1) * auVar15[0] | !(bool)(bVar5 & 1) * auVar23[0];
    bVar2 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar12[1] = bVar2 * auVar15[1] | !bVar2 * auVar23[1];
    bVar2 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar12[2] = bVar2 * auVar15[2] | !bVar2 * auVar23[2];
    bVar2 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar12[3] = bVar2 * auVar15[3] | !bVar2 * auVar23[3];
    bVar2 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar12[4] = bVar2 * auVar15[4] | !bVar2 * auVar23[4];
    bVar2 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar12[5] = bVar2 * auVar15[5] | !bVar2 * auVar23[5];
    bVar2 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar12[6] = bVar2 * auVar15[6] | !bVar2 * auVar23[6];
    bVar2 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar12[7] = bVar2 * auVar15[7] | !bVar2 * auVar23[7];
    auVar12[8] = (bVar6 & 1) * auVar15[8] | !(bool)(bVar6 & 1) * auVar23[8];
    bVar2 = (bool)(bVar6 >> 1 & 1);
    auVar12[9] = bVar2 * auVar15[9] | !bVar2 * auVar23[9];
    bVar2 = (bool)(bVar6 >> 2 & 1);
    auVar12[10] = bVar2 * auVar15[10] | !bVar2 * auVar23[10];
    bVar2 = (bool)(bVar6 >> 3 & 1);
    auVar12[0xb] = bVar2 * auVar15[0xb] | !bVar2 * auVar23[0xb];
    bVar2 = (bool)(bVar6 >> 4 & 1);
    auVar12[0xc] = bVar2 * auVar15[0xc] | !bVar2 * auVar23[0xc];
    bVar2 = (bool)(bVar6 >> 5 & 1);
    auVar12[0xd] = bVar2 * auVar15[0xd] | !bVar2 * auVar23[0xd];
    bVar2 = (bool)(bVar6 >> 6 & 1);
    auVar12[0xe] = bVar2 * auVar15[0xe] | !bVar2 * auVar23[0xe];
    auVar12[0xf] = -((char)bVar6 >> 7) * auVar15[0xf] | !(bool)-((char)bVar6 >> 7) * auVar23[0xf];
    auVar15 = vpternlogq_avx512vl(auVar12,auVar12,auVar12,0xf);
    auVar12 = vpsrlw_avx(auVar15,8);
    auVar15 = vpminub_avx(auVar15,auVar12);
    auVar15 = vphminposuw_avx(auVar15);
    local_c = (uint)(byte)~auVar15[0];
    __position._M_current =
         (this->blocks_bitsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->blocks_bitsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->blocks_bitsizes,__position,&local_c);
    }
    else {
      *__position._M_current = local_c;
      (this->blocks_bitsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  flush_to_file(this);
  iVar7 = std::ofstream::close();
  return iVar7;
}

Assistant:

void close(){

		assert(write);

		//in this case we did not compute last bitsize
		if(buffer.size()%block_size != 0){

			uint8_t max_bitsize = 0;

			for(uint64_t i=(buffer.size()/block_size)*block_size;i<buffer.size();++i){

				max_bitsize = std::max(max_bitsize,wd(buffer[i]));

			}

			blocks_bitsizes.push_back(max_bitsize);

		}

		flush_to_file();

		out.close();

	}